

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O0

XXH_INLINE_XXH128_hash_t
XXH128_mix32B(XXH_INLINE_XXH128_hash_t acc,xxh_u8 *input_1,xxh_u8 *input_2,xxh_u8 *secret,
             XXH64_hash_t seed)

{
  XXH_INLINE_XXH128_hash_t XVar1;
  xxh_u64 xVar2;
  xxh_u8 *pxVar3;
  xxh_u64 xVar4;
  xxh_u8 *pxVar5;
  xxh_u64 in_RDX;
  xxh_u8 *in_RSI;
  xxh_u8 *in_RDI;
  
  xVar2 = XXH3_mix16B(in_RSI,in_RDI,in_RDX);
  pxVar3 = in_RDI + xVar2;
  xVar2 = XXH_readLE64((void *)0x10b850);
  xVar4 = XXH_readLE64((void *)0x10b862);
  pxVar3 = (xxh_u8 *)((ulong)pxVar3 ^ xVar2 + xVar4);
  xVar2 = XXH3_mix16B(in_RSI,pxVar3,in_RDX);
  pxVar5 = in_RSI + xVar2;
  xVar2 = XXH_readLE64((void *)0x10b8a8);
  xVar4 = XXH_readLE64((void *)0x10b8bb);
  XVar1.high64 = (ulong)pxVar5 ^ xVar2 + xVar4;
  XVar1.low64 = (XXH64_hash_t)pxVar3;
  return XVar1;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH128_mix32B(XXH128_hash_t acc, const xxh_u8* input_1, const xxh_u8* input_2, const xxh_u8* secret, XXH64_hash_t seed)
{
    acc.low64  += XXH3_mix16B (input_1, secret+0, seed);
    acc.low64  ^= XXH_readLE64(input_2) + XXH_readLE64(input_2 + 8);
    acc.high64 += XXH3_mix16B (input_2, secret+16, seed);
    acc.high64 ^= XXH_readLE64(input_1) + XXH_readLE64(input_1 + 8);
    return acc;
}